

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::BsonType::write(BsonType *this)

{
  TProtocol *in_RSI;
  
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(in_RSI);
  (*in_RSI->_vptr_TProtocol[4])();
  (*in_RSI->_vptr_TProtocol[8])();
  (*in_RSI->_vptr_TProtocol[5])();
  in_RSI->output_recursion_depth_ = in_RSI->output_recursion_depth_ - 1;
  return;
}

Assistant:

uint32_t BsonType::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("BsonType");

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}